

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::CropLayerParams::CropLayerParams(CropLayerParams *this,CropLayerParams *from)

{
  BorderAmounts *from_00;
  BorderAmounts *this_00;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__CropLayerParams_003feb70;
  google::protobuf::RepeatedField<unsigned_long>::RepeatedField(&this->offset_,&from->offset_);
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  from_00 = from->cropamounts_;
  if (from_00 == (BorderAmounts *)0x0 ||
      from == (CropLayerParams *)_CropLayerParams_default_instance_) {
    this_00 = (BorderAmounts *)0x0;
  }
  else {
    this_00 = (BorderAmounts *)operator_new(0x30);
    BorderAmounts::BorderAmounts(this_00,from_00);
  }
  this->cropamounts_ = this_00;
  return;
}

Assistant:

CropLayerParams::CropLayerParams(const CropLayerParams& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      offset_(from.offset_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  if (from._internal_has_cropamounts()) {
    cropamounts_ = new ::CoreML::Specification::BorderAmounts(*from.cropamounts_);
  } else {
    cropamounts_ = nullptr;
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.CropLayerParams)
}